

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

void __thiscall VCPostBuildEventTool::VCPostBuildEventTool(VCPostBuildEventTool *this)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.m_data = (storage_type *)0xe;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar1);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  VCEventTool::VCEventTool(&this->super_VCEventTool,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->super_VCEventTool).super_VCToolBase._vptr_VCToolBase =
       (_func_int **)&PTR__VCEventTool_002dfa58;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VCPostBuildEventTool::VCPostBuildEventTool()
    : VCEventTool("PostBuildEvent")
{
}